

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * __thiscall
slang::ast::EnumType::fromSyntax
          (EnumType *this,Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  uint32_t *puVar1;
  DataTypeSyntax *node;
  SyntaxNode *this_00;
  byte *pbVar2;
  value_type_pointer pbVar3;
  size_t sVar4;
  EqualsValueClauseSyntax *pEVar5;
  int *piVar6;
  bool bVar7;
  bitwidth_t bVar8;
  Type *this_01;
  Diagnostic *diag;
  SourceLocation SVar9;
  EnumType *pEVar10;
  Compilation *compilation;
  EnumValueSymbol *pEVar11;
  long lVar12;
  RangeSelectSyntax *range;
  ulong uVar13;
  _Optional_payload_base<int> index;
  Scope *this_02;
  string_view sVar14;
  SourceRange SVar15;
  bool first;
  bitwidth_t bitWidth;
  Type *cb;
  EnumType *local_298;
  Type *base;
  ASTContext *local_288;
  _func_void_intptr_t_Symbol_ptr *local_280;
  anon_class_8_1_bc11688f local_278;
  const_iterator __begin2;
  EvaluatedDimension dim;
  SVInt one;
  SVInt allOnes;
  SourceRange previousRange;
  ConstantValue previous;
  anon_class_16_2_bd45431b checkValue;
  anon_class_56_7_20ba5b4c setInitializer;
  anon_class_80_10_279d319d inferValue;
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  usedValues;
  
  local_280 = insertCB.callback;
  bitWidth = 0x20;
  node = *(DataTypeSyntax **)&(comp->options).maxConstexprBacktrace;
  local_288 = context;
  if (node == (DataTypeSyntax *)0x0) {
    this_01 = (Type *)this[2].super_IntegralType.super_Type.super_Symbol.nextInScope;
    cb = this_01;
    base = this_01;
  }
  else {
    base = Compilation::getType((Compilation *)this,node,(ASTContext *)syntax,(Type *)0x0);
    this_01 = Type::getCanonicalType(base);
    cb = this_01;
    bVar7 = Type::isError(this_01);
    if (bVar7) {
      bVar8 = 0x20;
      goto LAB_002e9836;
    }
    bVar7 = Type::isSimpleBitVector(this_01);
    if ((!bVar7) &&
       (this_00 = *(SyntaxNode **)&(comp->options).maxConstexprBacktrace, this_00->kind == NamedType
       )) {
      usedValues.super_Storage.buffer._0_16_ = slang::syntax::SyntaxNode::getFirstToken(this_00);
      SVar9 = parsing::Token::location((Token *)&usedValues);
      diag = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0xf0009,SVar9);
      ast::operator<<(diag,base);
      this_01 = (Type *)this[2].super_Scope.nameMap;
      bVar8 = bitWidth;
      cb = this_01;
      goto LAB_002e9836;
    }
  }
  bVar8 = Type::getBitWidth(this_01);
  bitWidth = bVar8;
LAB_002e9836:
  bVar7 = Type::isSigned(this_01);
  SVInt::SVInt(&allOnes,bVar8,0,bVar7);
  SVInt::setAllOnes(&allOnes);
  bVar8 = bitWidth;
  bVar7 = Type::isSigned(cb);
  SVInt::SVInt(&one,bVar8,1,bVar7);
  previous.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._M_index = '\0';
  previousRange.startLoc = (SourceLocation)0x0;
  previousRange.endLoc = (SourceLocation)0x0;
  first = true;
  SVar9 = parsing::Token::location((Token *)&(comp->options).maxCheckerInstanceDepth);
  usedValues.super_Storage.buffer._0_8_ = SVar9;
  pEVar10 = BumpAllocator::
            emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::ASTContext_const&>
                      ((BumpAllocator *)this,(Compilation *)this,(SourceLocation *)&usedValues,base,
                       (ASTContext *)syntax);
  (pEVar10->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)comp;
  pbVar2 = (comp->super_BumpAllocator).endPtr;
  if ((pbVar2 != (byte *)0x0) && (*(undefined4 *)pbVar2 == 0x1dd)) {
    sVar14 = parsing::Token::valueText((Token *)(pbVar2 + 0x68));
    (pEVar10->super_IntegralType).super_Type.super_Symbol.name = sVar14;
  }
  bVar7 = Type::isError(cb);
  local_298 = pEVar10;
  if (bVar7) {
    local_298 = (EnumType *)cb;
  }
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  ::SmallMap(&usedValues);
  setInitializer.checkValue = &checkValue;
  setInitializer.first = &first;
  setInitializer.previous = &previous;
  setInitializer.previousRange = &previousRange;
  setInitializer.bitWidth = &bitWidth;
  index = (_Optional_payload_base<int>)&base;
  inferValue.cb = &cb;
  inferValue.allOnes = &allOnes;
  puVar1 = &(comp->options).typoCorrectionLimit;
  __begin2.index = 0;
  inferValue.one = &one;
  pbVar3 = (comp->options).topModules.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
           .arrays.elements_;
  this_02 = &pEVar10->super_Scope;
  __begin2.list = (ParentList *)puVar1;
  checkValue.usedValues = &usedValues;
  checkValue.context = (ASTContext *)syntax;
  setInitializer.context = (ASTContext *)syntax;
  setInitializer.base = (Type **)index;
  inferValue.first = setInitializer.first;
  inferValue.bitWidth = setInitializer.bitWidth;
  inferValue.previous = setInitializer.previous;
  inferValue.context = (ASTContext *)syntax;
  inferValue.base = (Type **)index;
  inferValue.previousRange = setInitializer.previousRange;
  inferValue.checkValue = setInitializer.checkValue;
  do {
    if ((__begin2.list == (ParentList *)puVar1) &&
       (__begin2.index == (ulong)((long)&pbVar3->_M_len + 1U) >> 1)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::SVInt,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::SVInt,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
                     *)&usedValues.super_Storage.field_0xc8);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&previous);
      SVInt::~SVInt(&one);
      SVInt::~SVInt(&allOnes);
      return (Type *)local_298;
    }
    compilation = (Compilation *)
                  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
                  iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&__begin2);
    sVar4 = (compilation->options).topModules.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.groups_size_index;
    if (sVar4 == 1) {
LAB_002e9a77:
      ASTContext::evalUnpackedDimension
                (&dim,(ASTContext *)syntax,
                 (VariableDimensionSyntax *)
                 **(undefined8 **)
                   &(compilation->options).defaultTimeScale.
                    super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::TimeScale>._M_engaged);
      if (dim.kind - Range < 2) {
        uVar13 = (ulong)(uint)dim.range.left;
        SVar15 = slang::syntax::SyntaxNode::sourceRange
                           ((SyntaxNode *)
                            **(undefined8 **)
                              &(compilation->options).defaultTimeScale.
                               super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                               super__Optional_payload_base<slang::TimeScale>._M_engaged);
        bVar7 = ASTContext::requirePositive
                          ((ASTContext *)syntax,(optional<int>)(uVar13 | 0x100000000),SVar15);
        if (bVar7) {
          uVar13 = (ulong)(uint)dim.range.right;
          SVar15 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              **(undefined8 **)
                                &(compilation->options).defaultTimeScale.
                                 super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                 super__Optional_payload_base<slang::TimeScale>._M_engaged);
          bVar7 = ASTContext::requirePositive
                            ((ASTContext *)syntax,(optional<int>)(uVar13 | 0x100000000),SVar15);
          if (bVar7) {
            piVar6 = *(int **)(*(long *)(**(long **)&(compilation->options).defaultTimeScale.
                                                                                                          
                                                  super__Optional_base<slang::TimeScale,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<slang::TimeScale>.
                                                  _M_engaged + 0x28) + 0x18);
            lVar12 = 0x18;
            local_278.context = (ASTContext *)syntax;
            if (*piVar6 == 0x35) {
LAB_002e9b3d:
              checkEnumRange::anon_class_8_1_bc11688f::operator()
                        (&local_278,*(ExpressionSyntax **)((long)piVar6 + lVar12));
            }
            else if (*piVar6 == 0x1b0) {
              checkEnumRange::anon_class_8_1_bc11688f::operator()
                        (&local_278,*(ExpressionSyntax **)(piVar6 + 6));
              lVar12 = 0x30;
              goto LAB_002e9b3d;
            }
            uVar13 = (ulong)(uint)dim.range.left;
            pEVar11 = EnumValueSymbol::fromSyntax
                                ((EnumValueSymbol *)this,compilation,(DeclaratorSyntax *)local_298,
                                 (Type *)(uVar13 | 0x100000000),(optional<int>)index);
            Scope::addMember(this_02,(Symbol *)pEVar11);
            (*(code *)local_288)(local_280,pEVar11);
            pEVar5 = (EqualsValueClauseSyntax *)
                     (compilation->options).topModules.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.groups_size_mask;
            if (pEVar5 == (EqualsValueClauseSyntax *)0x0) {
              SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
              fromSyntax::anon_class_80_10_279d319d::operator()(&inferValue,pEVar11,SVar15);
            }
            else {
              fromSyntax::anon_class_56_7_20ba5b4c::operator()(&setInitializer,pEVar11,pEVar5);
            }
            bVar7 = dim.range.left < dim.range.right;
            while ((int)uVar13 != dim.range.right) {
              uVar13 = (ulong)((int)uVar13 + (uint)bVar7 * 2 + -1);
              pEVar11 = EnumValueSymbol::fromSyntax
                                  ((EnumValueSymbol *)this,compilation,(DeclaratorSyntax *)local_298
                                   ,(Type *)(uVar13 | 0x100000000),(optional<int>)index);
              Scope::addMember(this_02,(Symbol *)pEVar11);
              (*(code *)local_288)(local_280,pEVar11);
              SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
              fromSyntax::anon_class_80_10_279d319d::operator()(&inferValue,pEVar11,SVar15);
            }
          }
        }
      }
    }
    else {
      if (sVar4 != 0) {
        SVar15 = slang::syntax::SyntaxNode::sourceRange
                           ((SyntaxNode *)&(compilation->options).maxInstanceArray);
        ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x40009,SVar15);
        goto LAB_002e9a77;
      }
      pEVar11 = EnumValueSymbol::fromSyntax
                          ((EnumValueSymbol *)this,compilation,(DeclaratorSyntax *)local_298,
                           (Type *)0x0,(optional<int>)index);
      Scope::addMember(this_02,(Symbol *)pEVar11);
      (*(code *)local_288)(local_280,pEVar11);
      pEVar5 = (EqualsValueClauseSyntax *)
               (compilation->options).topModules.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      if (pEVar5 == (EqualsValueClauseSyntax *)0x0) {
        SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
        fromSyntax::anon_class_80_10_279d319d::operator()(&inferValue,pEVar11,SVar15);
      }
      else {
        fromSyntax::anon_class_56_7_20ba5b4c::operator()(&setInitializer,pEVar11,pEVar5);
      }
    }
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

const Type& EnumType::fromSyntax(Compilation& comp, const EnumTypeSyntax& syntax,
                                 const ASTContext& context,
                                 function_ref<void(const Symbol&)> insertCB) {
    const Type* base;
    const Type* cb;
    bitwidth_t bitWidth = 32;

    if (!syntax.baseType) {
        // If no explicit base type is specified we default to an int.
        base = &comp.getIntType();
        cb = base;
        bitWidth = cb->getBitWidth();
    }
    else {
        base = &comp.getType(*syntax.baseType, context);
        cb = &base->getCanonicalType();
        if (!cb->isError()) {
            // Error if the named type is invalid for an enum base type. Other invalid types
            // will have been diagnosed already by the parser.
            if (!cb->isSimpleBitVector() && syntax.baseType->kind == SyntaxKind::NamedType) {
                context.addDiag(diag::InvalidEnumBase, syntax.baseType->getFirstToken().location())
                    << *base;
                cb = &comp.getErrorType();
            }
            else {
                bitWidth = cb->getBitWidth();
                SLANG_ASSERT(bitWidth);
            }
        }
    }

    SVInt allOnes(bitWidth, 0, cb->isSigned());
    allOnes.setAllOnes();

    SVInt one(bitWidth, 1, cb->isSigned());
    ConstantValue previous;
    SourceRange previousRange;
    bool first = true;

    auto enumType = comp.emplace<EnumType>(comp, syntax.keyword.location(), *base, context);
    enumType->setSyntax(syntax);

    // If this enum is inside a typedef we want to save the name here so that
    // when printing the types of our enum values we can refer back to this.
    if (syntax.parent && syntax.parent->kind == SyntaxKind::TypedefDeclaration)
        enumType->name = syntax.parent->as<TypedefDeclarationSyntax>().name.valueText();

    auto resultType = cb->isError() ? cb : enumType;

    // Enum values must be unique; this set and lambda are used to check that.
    SmallMap<SVInt, SourceLocation, 8> usedValues;
    auto checkValue = [&usedValues, &context](const ConstantValue& cv, SourceLocation loc) {
        if (!cv)
            return;

        auto& value = cv.integer();
        auto pair = usedValues.emplace(value, loc);
        if (!pair.second) {
            auto& diag = context.addDiag(diag::EnumValueDuplicate, loc) << value;
            diag.addNote(diag::NotePreviousDefinition, pair.first->second);
        }
    };

    // For enumerands that have an initializer, set it up appropriately.
    auto setInitializer = [&](EnumValueSymbol& ev, const EqualsValueClauseSyntax& initializer) {
        // Clear our previous state in case there's an error and we need to exit early.
        first = false;
        previous = nullptr;

        // Create the initializer expression.
        ev.setInitializerSyntax(*initializer.expr, initializer.equals.location());
        auto initExpr = ev.getInitializer();
        SLANG_ASSERT(initExpr);
        if (initExpr->bad())
            return;

        // Drill down to the original initializer before any conversions are applied.
        initExpr = &initExpr->unwrapImplicitConversions();
        previousRange = initExpr->sourceRange;

        // [6.19] says that the initializer for an enum value must be an integer expression that
        // does not truncate any bits. Furthermore, if a sized literal constant is used, it must
        // be sized exactly to the size of the enum base type.
        auto& rt = *initExpr->type;
        if (!rt.isIntegral()) {
            context.addDiag(diag::ValueMustBeIntegral, previousRange);
            return;
        }

        if (bitWidth != rt.getBitWidth() && initExpr->kind == ExpressionKind::IntegerLiteral &&
            !initExpr->as<IntegerLiteral>().isDeclaredUnsized) {
            auto& diag = context.addDiag(diag::EnumValueSizeMismatch, previousRange);
            diag << rt.getBitWidth() << bitWidth;
        }

        ev.getValue();
        if (!initExpr->constant)
            return;

        // An enumerated name with x or z assignments assigned to an enum with no explicit data type
        // or an explicit 2-state declaration shall be a syntax error.
        auto& value = initExpr->constant->integer();
        if (!base->isFourState() && value.hasUnknown()) {
            context.addDiag(diag::EnumValueUnknownBits, previousRange) << value << *base;
            return;
        }

        // Any enumeration encoding value that is outside the representable range of the enum base
        // type shall be an error. For an unsigned base type, this occurs if the cast truncates the
        // value and any of the discarded bits are nonzero. For a signed base type, this occurs if
        // the cast truncates the value and any of the discarded bits are not equal to the sign bit
        // of the result.
        if (value.getBitWidth() > bitWidth) {
            bool good = true;
            if (!base->isSigned()) {
                good = exactlyEqual(value[int32_t(bitWidth)], logic_t(false)) &&
                       value.isSignExtendedFrom(bitWidth);
            }
            else {
                good = value.isSignExtendedFrom(bitWidth - 1);
            }

            if (!good) {
                context.addDiag(diag::EnumValueOutOfRange, previousRange) << value << *base;
                return;
            }
        }

        previous = ev.getValue();
        checkValue(previous, previousRange.start());
    };

    // For enumerands that have no initializer, infer the value via this function.
    auto inferValue = [&](EnumValueSymbol& ev, SourceRange range) {
        auto loc = range.start();
        SVInt value;
        if (first) {
            value = SVInt(bitWidth, 0, cb->isSigned());
            first = false;
        }
        else if (!previous) {
            return;
        }
        else {
            auto& prev = previous.integer();
            if (prev.hasUnknown()) {
                auto& diag = context.addDiag(diag::EnumIncrementUnknown, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }
            else if (prev == allOnes) {
                auto& diag = context.addDiag(diag::EnumValueOverflow, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }

            value = prev + one;
        }

        checkValue(value, loc);

        ev.setValue(value);
        previous = std::move(value);
        previousRange = range;
    };

    for (auto member : syntax.members) {
        if (member->dimensions.empty()) {
            auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, std::nullopt);
            enumType->addMember(ev);
            insertCB(ev);

            if (member->initializer)
                setInitializer(ev, *member->initializer);
            else
                inferValue(ev, member->sourceRange());
        }
        else {
            if (member->dimensions.size() > 1) {
                context.addDiag(diag::EnumRangeMultiDimensional, member->dimensions.sourceRange());
            }

            auto dim = context.evalUnpackedDimension(*member->dimensions[0]);
            if (!dim.isRange())
                continue;

            // Range must be positive.
            if (!context.requirePositive(std::optional(dim.range.left),
                                         member->dimensions[0]->sourceRange()) ||
                !context.requirePositive(std::optional(dim.range.right),
                                         member->dimensions[0]->sourceRange())) {
                continue;
            }

            // Enum ranges must be integer literals.
            checkEnumRange(context, *member->dimensions[0]);

            // Set up the first element using the initializer. All other elements (if there are any)
            // don't get the initializer.
            int32_t index = dim.range.left;
            {
                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                if (member->initializer)
                    setInitializer(ev, *member->initializer);
                else
                    inferValue(ev, member->sourceRange());
            }

            bool down = dim.range.isLittleEndian();
            while (index != dim.range.right) {
                index = down ? index - 1 : index + 1;

                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                inferValue(ev, member->sourceRange());
            }
        }
    }

    return *resultType;
}